

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_port_client.cpp
# Opt level: O0

int main(void)

{
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [32];
  connect_call_back local_48;
  undefined1 local_18 [8];
  CppNet net;
  
  cppnet::CppNet::CppNet((CppNet *)local_18);
  cppnet::CppNet::Init((CppNet *)local_18,1);
  std::function<void(std::shared_ptr<cppnet::CNSocket>,unsigned_int)>::
  function<void(&)(std::shared_ptr<cppnet::CNSocket>,unsigned_int),void>
            ((function<void(std::shared_ptr<cppnet::CNSocket>,unsigned_int)> *)&local_48,ConnectFunc
            );
  cppnet::CppNet::SetConnectionCallback((CppNet *)local_18,&local_48);
  std::function<void_(std::shared_ptr<cppnet::CNSocket>,_unsigned_int)>::~function(&local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"127.0.0.1",&local_69);
  cppnet::CppNet::Connection((CppNet *)local_18,(string *)local_68,0x22d9);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"127.0.0.1",&local_91);
  cppnet::CppNet::Connection((CppNet *)local_18,(string *)local_90,0x22da);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  cppnet::Sleep(2000);
  cppnet::CppNet::~CppNet((CppNet *)local_18);
  return 0;
}

Assistant:

int main() {

    cppnet::CppNet net;
    net.Init(1);
    net.SetConnectionCallback(ConnectFunc);

    net.Connection("127.0.0.1", 8921);
    net.Connection("127.0.0.1", 8922);

    Sleep(2000);
}